

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O1

string * DirUtils::GetLastPath(string *__return_storage_ptr__,string *p)

{
  pointer pcVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  
  uVar4 = (ulong)(uint)p->_M_string_length;
  lVar3 = 0;
  do {
    if ((int)uVar4 < 1) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar1 = (p->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar1,pcVar1 + p->_M_string_length,lVar3);
      return __return_storage_ptr__;
    }
    lVar3 = lVar3 + 1;
    lVar2 = uVar4 - 1;
    uVar4 = uVar4 - 1;
  } while ((p->_M_dataplus)._M_p[lVar2] != '/');
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)p);
  return __return_storage_ptr__;
}

Assistant:

string DirUtils::GetLastPath(const string& p){
	int l = p.length();
	for(int i = l - 1; i >= 0; i--){
		if(p[i] == '/')
			return p.substr(i + 1, l - i - 1);
	}
	return p;
}